

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

string * rcg::getEnum_abi_cxx11_
                   (shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,bool exception)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  char *pcVar5;
  invalid_argument *piVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  byte in_CL;
  char *in_RDX;
  string *in_RDI;
  GenericException *ex;
  IEnumEntry *entry;
  IEnumeration *val;
  INode *node;
  string *ret;
  IBase *in_stack_fffffffffffffd50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd58;
  long *local_258;
  allocator local_201;
  string local_200 [32];
  string local_1e0 [38];
  undefined1 local_1ba;
  allocator local_1b9;
  string local_1b8 [32];
  string local_198 [38];
  undefined1 local_172;
  allocator local_171;
  string local_170 [32];
  string local_150 [38];
  undefined1 local_12a;
  allocator local_129;
  string local_128 [32];
  string local_108 [32];
  gcstring local_e8 [80];
  long *local_98;
  long *local_90;
  gcstring local_78 [80];
  long local_28;
  undefined1 local_1a;
  byte local_19;
  char *local_18;
  long lVar4;
  
  local_19 = in_CL & 1;
  local_1a = 0;
  local_18 = in_RDX;
  std::__cxx11::string::string(in_RDI);
  peVar3 = std::
           __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1337f7);
  GenICam_3_4::gcstring::gcstring(local_78,local_18);
  iVar2 = (*(peVar3->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar3,local_78);
  lVar4 = CONCAT44(extraout_var,iVar2);
  GenICam_3_4::gcstring::~gcstring(local_78);
  local_28 = lVar4;
  if (lVar4 == 0) {
    if ((local_19 & 1) != 0) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_200,"Feature not found: ",&local_201);
      std::operator+(__lhs,(char *)in_stack_fffffffffffffd50);
      std::invalid_argument::invalid_argument((invalid_argument *)__lhs,local_1e0);
      __cxa_throw(__lhs,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    bVar1 = GenApi_3_4::IsReadable(in_stack_fffffffffffffd50);
    if (bVar1) {
      if (local_28 == 0) {
        local_258 = (long *)0x0;
      }
      else {
        local_258 = (long *)__dynamic_cast(local_28,&GenApi_3_4::INode::typeinfo,
                                           &GenApi_3_4::IEnumeration::typeinfo,0xfffffffffffffffe);
      }
      local_90 = local_258;
      if (local_258 == (long *)0x0) {
        if ((local_19 & 1) != 0) {
          local_172 = 1;
          piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_170,"Feature not enumeration: ",&local_171);
          std::operator+(in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50);
          std::invalid_argument::invalid_argument(piVar6,local_150);
          local_172 = 0;
          __cxa_throw(piVar6,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      else {
        local_98 = (long *)(**(code **)(*local_258 + 0x78))(local_258,0);
        if (local_98 == (long *)0x0) {
          if ((local_19 & 1) != 0) {
            local_12a = 1;
            piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_128,"Current value is not defined: ",&local_129);
            std::operator+(in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50);
            std::invalid_argument::invalid_argument(piVar6,local_108);
            local_12a = 0;
            __cxa_throw(piVar6,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
        }
        else {
          (**(code **)(*local_98 + 0x40))(local_e8);
          pcVar5 = GenICam_3_4::gcstring::operator_cast_to_char_(local_e8);
          std::__cxx11::string::operator=(in_RDI,pcVar5);
          GenICam_3_4::gcstring::~gcstring(local_e8);
        }
      }
    }
    else if ((local_19 & 1) != 0) {
      local_1ba = 1;
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b8,"Feature not readable: ",&local_1b9);
      std::operator+(in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50);
      std::invalid_argument::invalid_argument(piVar6,local_198);
      local_1ba = 0;
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  return in_RDI;
}

Assistant:

std::string getEnum(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
                    bool exception)
{
  std::string ret;

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsReadable(node))
      {
        GenApi::IEnumeration *val=dynamic_cast<GenApi::IEnumeration *>(node);

        if (val != 0)
        {
          GenApi::IEnumEntry *entry=val->GetCurrentEntry();

          if (entry != 0)
          {
            ret=entry->GetSymbolic();
          }
          else if (exception)
          {
            throw std::invalid_argument(std::string("Current value is not defined: ")+name);
          }
        }
        else if (exception)
        {
          throw std::invalid_argument(std::string("Feature not enumeration: ")+name);
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not readable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}